

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getLongRangePotential(Snapshot *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  if (this->hasLongRangePotential == true) {
    return (this->frameData).longRangePotential;
  }
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + (this->frameData).lrPotentials.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  dVar2 = dVar2 + (this->frameData).reciprocalPotential + (this->frameData).surfacePotential;
  (this->frameData).longRangePotential = dVar2;
  this->hasLongRangePotential = true;
  this->hasPotentialEnergy = false;
  this->hasTotalEnergy = false;
  return dVar2;
}

Assistant:

RealType Snapshot::getLongRangePotential() {
    if (!hasLongRangePotential) {
      frameData.longRangePotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.longRangePotential += frameData.lrPotentials[i];
      }
      frameData.longRangePotential += frameData.reciprocalPotential;
      frameData.longRangePotential += frameData.surfacePotential;
      hasLongRangePotential = true;
      hasPotentialEnergy    = false;
      hasTotalEnergy        = false;
    }
    return frameData.longRangePotential;
  }